

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_client.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::DirectClient::DirectClient(DirectClient *this,string *host,int port)

{
  bool bVar1;
  allocator<char> local_61;
  string local_60;
  shared_ptr<spdlog::logger> local_40 [2];
  int local_1c;
  string *psStack_18;
  int port_local;
  string *host_local;
  DirectClient *this_local;
  
  local_1c = port;
  psStack_18 = host;
  host_local = (string *)this;
  Client::Client(&this->super_Client);
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__DirectClient_003a4e80;
  std::__cxx11::string::string((string *)&this->host_);
  OutputStreamImpl::OutputStreamImpl(&this->output_stream_,this);
  InputStreamImpl::InputStreamImpl(&this->input_stream_,this);
  bVar1 = std::operator==((shared_ptr<spdlog::logger> *)Log,(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"DirectClient",&local_61)
    ;
    LoggerFactory::GetLogger((LoggerFactory *)local_40,&local_60);
    std::shared_ptr<spdlog::logger>::operator=((shared_ptr<spdlog::logger> *)Log,local_40);
    std::shared_ptr<spdlog::logger>::~shared_ptr(local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  std::__cxx11::string::operator=((string *)&this->host_,(string *)host);
  this->port_ = local_1c;
  return;
}

Assistant:

DirectClient::DirectClient(std::string host, int port) : output_stream_(OutputStreamImpl(*this)), input_stream_(InputStreamImpl(*this))
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("DirectClient");
    }
    host_ = std::move(host);
    port_ = port;
}